

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
kj::ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::ListIterator
          (ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *this,
          Maybe<kj::_::XThreadPaf_&> *start)

{
  Maybe<kj::_::XThreadPaf_&> *other;
  Maybe<kj::_::XThreadPaf_&> local_38 [2];
  Maybe<kj::Maybe<kj::_::XThreadPaf_&>_> local_28;
  Maybe<kj::_::XThreadPaf_&> *local_18;
  Maybe<kj::_::XThreadPaf_&> *start_local;
  ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *this_local;
  
  local_18 = start;
  start_local = &this->current;
  Maybe<kj::_::XThreadPaf_&>::Maybe(&this->current,start);
  Maybe<kj::_::XThreadPaf_&>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_list_h:217:24)>
            ((Maybe<kj::_::XThreadPaf_&> *)&local_28,(anon_class_1_0_00000001 *)start);
  Maybe<kj::_::XThreadPaf_&>::Maybe(local_38);
  other = Maybe<kj::Maybe<kj::_::XThreadPaf_&>_>::orDefault(&local_28,local_38);
  Maybe<kj::_::XThreadPaf_&>::Maybe(&this->next,other);
  Maybe<kj::Maybe<kj::_::XThreadPaf_&>_>::~Maybe(&local_28);
  return;
}

Assistant:

explicit ListIterator(Maybe<MaybeConstT&> start)
      : current(start),
        next(start.map([](MaybeConstT& obj) -> kj::Maybe<MaybeConstT&> { return (obj.*link).next; })
            .orDefault(kj::none)) {}